

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

Chainstate * __thiscall ChainstateManager::GetChainstateForIndexing(ChainstateManager *this)

{
  _Head_base<0UL,_Chainstate_*,_false> _Var1;
  _Head_base<0UL,_Chainstate_*,_false> _Var2;
  long in_FS_OFFSET;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  GetAll(&local_40,this);
  _Var1._M_head_impl =
       (this->m_ibd_chainstate)._M_t.
       super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
       super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
       super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
  _Var2._M_head_impl = this->m_active_chainstate;
  if (local_40.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (8 < (ulong)((long)local_40.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_40.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                       _M_impl.super__Vector_impl_data._M_start)) {
    _Var2._M_head_impl = _Var1._M_head_impl;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return _Var2._M_head_impl;
  }
  __stack_chk_fail();
}

Assistant:

Chainstate& ChainstateManager::GetChainstateForIndexing()
{
    // We can't always return `m_ibd_chainstate` because after background validation
    // has completed, `m_snapshot_chainstate == m_active_chainstate`, but it can be
    // indexed.
    return (this->GetAll().size() > 1) ? *m_ibd_chainstate : *m_active_chainstate;
}